

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall helics::CoreBroker::setLogFile(CoreBroker *this,string_view lfile)

{
  size_t size;
  ActionMessage cmd;
  ActionMessage AStack_d8;
  
  size = lfile._M_len;
  ActionMessage::ActionMessage(&AStack_d8,cmd_broker_configure);
  AStack_d8.dest_id.gid = (this->super_BrokerBase).global_id._M_i.gid;
  AStack_d8.messageID = 0x252;
  AStack_d8.payload.bufferSize = size;
  if ((AStack_d8.payload.heap != (byte *)lfile._M_str) &&
     (SmallBuffer::reserve(&AStack_d8.payload,size), size != 0)) {
    memcpy(AStack_d8.payload.heap,lfile._M_str,size);
  }
  BrokerBase::addActionMessage(&this->super_BrokerBase,&AStack_d8);
  ActionMessage::~ActionMessage(&AStack_d8);
  return;
}

Assistant:

void CoreBroker::setLogFile(std::string_view lfile)
{
    ActionMessage cmd(CMD_BROKER_CONFIGURE);
    cmd.dest_id = global_id.load();
    cmd.messageID = UPDATE_LOGGING_FILE;
    cmd.payload = lfile;
    addActionMessage(cmd);
}